

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O1

void duckdb::MinMaxNOperation::
     Combine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
               (ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,_duckdb::MinMaxFixedValue<float>,_duckdb::GreaterThan>
                *source,ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,_duckdb::MinMaxFixedValue<float>,_duckdb::GreaterThan>
                        *target,AggregateInputData *aggr_input)

{
  idx_t iVar1;
  ArenaAllocator *pAVar2;
  InvalidInputException *this;
  STORAGE_TYPE *pSVar3;
  long lVar4;
  ulong uVar5;
  string local_50;
  
  if (source->is_initialized == true) {
    if (target->is_initialized == false) {
      pAVar2 = aggr_input->allocator;
      iVar1 = (source->heap).capacity;
      (target->heap).capacity = iVar1;
      pSVar3 = (STORAGE_TYPE *)ArenaAllocator::AllocateAligned(pAVar2,iVar1 << 3);
      switchD_01306cb1::default(pSVar3,0,(target->heap).capacity << 3);
      (target->heap).heap = pSVar3;
      (target->heap).size = 0;
      target->is_initialized = true;
    }
    else if ((source->heap).capacity != (target->heap).capacity) {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Mismatched n values in min/max/arg_min/arg_max","");
      InvalidInputException::InvalidInputException(this,&local_50);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((source->heap).size != 0) {
      pAVar2 = aggr_input->allocator;
      lVar4 = 0;
      uVar5 = 0;
      do {
        pSVar3 = (source->heap).heap;
        BinaryAggregateHeap<float,_int,_duckdb::GreaterThan>::Insert
                  (&target->heap,pAVar2,(float *)((long)&(pSVar3->first).value + lVar4),
                   (int *)((long)&(pSVar3->second).value + lVar4));
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 8;
      } while (uVar5 < (source->heap).size);
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &aggr_input) {
		if (!source.is_initialized) {
			// source is empty, nothing to do
			return;
		}

		if (!target.is_initialized) {
			target.Initialize(aggr_input.allocator, source.heap.Capacity());
		} else if (source.heap.Capacity() != target.heap.Capacity()) {
			throw InvalidInputException("Mismatched n values in min/max/arg_min/arg_max");
		}

		// Merge the heaps
		target.heap.Insert(aggr_input.allocator, source.heap);
	}